

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNamedNodeMapImpl.cpp
# Opt level: O3

DOMNode * __thiscall
xercesc_4_0::DOMNamedNodeMapImpl::removeNamedItemNS
          (DOMNamedNodeMapImpl *this,XMLCh *namespaceURI,XMLCh *localName)

{
  XMLCh XVar1;
  XMLCh XVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  XMLCh *pXVar8;
  undefined4 extraout_var_02;
  DOMException *this_00;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long *plVar9;
  long lVar10;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  XMLCh *pXVar11;
  long lVar12;
  ulong index;
  DOMNode *pDVar13;
  MemoryManager **ppMVar14;
  XMLCh *pXVar7;
  undefined4 extraout_var_01;
  
  bVar4 = readOnly(this);
  if (bVar4) {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    ppMVar14 = &XMLPlatformUtils::fgMemoryManager;
    if ((this->fOwnerNode != (DOMNode *)0x0) &&
       (iVar5 = (*this->fOwnerNode->_vptr_DOMNode[0xc])(), CONCAT44(extraout_var_05,iVar5) != 0)) {
      iVar5 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
      ppMVar14 = (MemoryManager **)(CONCAT44(extraout_var_06,iVar5) + 0x158);
    }
    DOMException::DOMException(this_00,7,0,*ppMVar14);
  }
  else {
    lVar12 = 0;
    do {
      if (this->fBuckets[lVar12] != (DOMNodeVector *)0x0) {
        iVar5 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
        uVar3 = this->fBuckets[lVar12]->nextFreeSlot;
        if (uVar3 != 0) {
          index = 0;
          do {
            if (index < this->fBuckets[lVar12]->nextFreeSlot) {
              pDVar13 = this->fBuckets[lVar12]->data[index];
            }
            else {
              pDVar13 = (DOMNode *)0x0;
            }
            iVar6 = (*pDVar13->_vptr_DOMNode[0x16])(pDVar13);
            pXVar7 = (XMLCh *)CONCAT44(extraout_var_00,iVar6);
            iVar6 = (*pDVar13->_vptr_DOMNode[0x18])(pDVar13);
            pXVar8 = (XMLCh *)CONCAT44(extraout_var_01,iVar6);
            if (pXVar7 == namespaceURI) {
LAB_0027108d:
              if (pXVar8 != localName) {
                pXVar7 = pXVar8;
                if ((localName == (XMLCh *)0x0) || (pXVar11 = localName, pXVar8 == (XMLCh *)0x0)) {
                  if (localName == (XMLCh *)0x0) {
                    if (pXVar8 == (XMLCh *)0x0) goto LAB_002711ef;
LAB_002710f4:
                    XVar1 = *pXVar7;
                  }
                  else {
                    XVar1 = *localName;
                    if (XVar1 == L'\0' && pXVar8 != (XMLCh *)0x0) goto LAB_002710f4;
                  }
                  if (XVar1 == L'\0') goto LAB_002711ef;
                }
                else {
                  do {
                    XVar1 = *pXVar11;
                    if (XVar1 == L'\0') goto LAB_002710f4;
                    XVar2 = *pXVar7;
                    pXVar7 = pXVar7 + 1;
                    pXVar11 = pXVar11 + 1;
                  } while (XVar1 == XVar2);
                }
                if (pXVar8 != (XMLCh *)0x0) goto LAB_00271170;
                iVar6 = (*pDVar13->_vptr_DOMNode[2])(pDVar13);
                pXVar7 = (XMLCh *)CONCAT44(extraout_var_02,iVar6);
                if (pXVar7 == localName) goto LAB_002711ef;
                if ((localName != (XMLCh *)0x0) && (pXVar8 = localName, pXVar7 != (XMLCh *)0x0)) {
                  do {
                    XVar1 = *pXVar8;
                    if (XVar1 == L'\0') goto LAB_0027116a;
                    XVar2 = *pXVar7;
                    pXVar7 = pXVar7 + 1;
                    pXVar8 = pXVar8 + 1;
                  } while (XVar1 == XVar2);
                  goto LAB_00271170;
                }
                if (localName == (XMLCh *)0x0) {
                  if (pXVar7 == (XMLCh *)0x0) goto LAB_002711ef;
LAB_0027116a:
                  XVar1 = *pXVar7;
                }
                else {
                  XVar1 = *localName;
                  if (XVar1 == L'\0' && pXVar7 != (XMLCh *)0x0) goto LAB_0027116a;
                }
                if (XVar1 != L'\0') goto LAB_00271170;
              }
LAB_002711ef:
              DOMNodeVector::removeElementAt(this->fBuckets[lVar12],index);
              lVar12 = CONCAT44(extraout_var,iVar5) + 0x18;
              if (CONCAT44(extraout_var,iVar5) == 0) {
                lVar12 = 0;
              }
              plVar9 = (long *)__dynamic_cast(pDVar13,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,
                                              0xfffffffffffffffe);
              if ((plVar9 == (long *)0x0) ||
                 (lVar10 = (**(code **)(*plVar9 + 0x10))(plVar9), lVar10 == 0)) {
                this_00 = (DOMException *)__cxa_allocate_exception(0x28);
                DOMException::DOMException(this_00,0xb,0,XMLPlatformUtils::fgMemoryManager);
              }
              else {
                lVar10 = (**(code **)(*plVar9 + 0x10))(plVar9);
                *(long *)(lVar10 + 8) = lVar12;
                plVar9 = (long *)__dynamic_cast(pDVar13,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo
                                                ,0xfffffffffffffffe);
                if ((plVar9 != (long *)0x0) &&
                   (lVar12 = (**(code **)(*plVar9 + 0x10))(plVar9), lVar12 != 0)) {
                  lVar12 = (**(code **)(*plVar9 + 0x10))(plVar9);
                  *(ushort *)(lVar12 + 0x10) = *(ushort *)(lVar12 + 0x10) & 0xfff7;
                  return pDVar13;
                }
                this_00 = (DOMException *)__cxa_allocate_exception(0x28);
                DOMException::DOMException(this_00,0xb,0,XMLPlatformUtils::fgMemoryManager);
              }
              goto LAB_00271334;
            }
            pXVar11 = namespaceURI;
            if ((namespaceURI == (XMLCh *)0x0) || (pXVar7 == (XMLCh *)0x0)) {
              if (pXVar7 == (XMLCh *)0x0) {
                if (namespaceURI == (XMLCh *)0x0) goto LAB_0027108d;
LAB_00271083:
                XVar1 = *pXVar11;
              }
              else {
                XVar1 = *pXVar7;
                if ((namespaceURI != (XMLCh *)0x0) && (XVar1 == L'\0')) goto LAB_00271083;
              }
              if (XVar1 == L'\0') goto LAB_0027108d;
            }
            else {
              do {
                XVar1 = *pXVar7;
                if (XVar1 == L'\0') goto LAB_00271083;
                pXVar7 = pXVar7 + 1;
                XVar2 = *pXVar11;
                pXVar11 = pXVar11 + 1;
              } while (XVar1 == XVar2);
            }
LAB_00271170:
            index = index + 1;
          } while (index != uVar3);
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0xc1);
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    ppMVar14 = &XMLPlatformUtils::fgMemoryManager;
    if ((this->fOwnerNode != (DOMNode *)0x0) &&
       (iVar5 = (*this->fOwnerNode->_vptr_DOMNode[0xc])(), CONCAT44(extraout_var_03,iVar5) != 0)) {
      iVar5 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
      ppMVar14 = (MemoryManager **)(CONCAT44(extraout_var_04,iVar5) + 0x158);
    }
    DOMException::DOMException(this_00,8,0,*ppMVar14);
  }
LAB_00271334:
  __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

DOMNode *DOMNamedNodeMapImpl::removeNamedItemNS(const XMLCh *namespaceURI,
                                                 const XMLCh *localName)
{
    if (this->readOnly())
        throw DOMException(
        DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMNamedNodeMapMemoryManager);

    // the map is indexed using the full name of nodes; to search given a namespace and a local name
    // we have to do a linear search
    for (XMLSize_t index = 0; index < MAP_SIZE; index++) {
        if(fBuckets[index]==0)
            continue;

        DOMDocument *doc = fOwnerNode->getOwnerDocument();
        XMLSize_t i = 0;
        XMLSize_t size = fBuckets[index]->size();
        for (i = 0; i < size; ++i) {
            DOMNode *n=fBuckets[index]->elementAt(i);
            const XMLCh * nNamespaceURI = n->getNamespaceURI();
            const XMLCh * nLocalName = n->getLocalName();
            if (!XMLString::equals(nNamespaceURI, namespaceURI))    //URI not match
                continue;
            else {
                if (XMLString::equals(localName, nLocalName)
                    ||
                    (nLocalName == 0 && XMLString::equals(localName, n->getNodeName()))) {
                    fBuckets[index]->removeElementAt(i);
                    castToNodeImpl(n)->fOwnerNode = doc;
                    castToNodeImpl(n)->isOwned(false);
                    return n;
                }
            }
        }
    }
    throw DOMException(DOMException::NOT_FOUND_ERR, 0, GetDOMNamedNodeMapMemoryManager);
    return 0;
}